

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O0

bool __thiscall Controller::readBoardFromFile(Controller *this,string *file)

{
  value_type vVar1;
  bool bVar2;
  BoardSize size;
  BoardMode mode;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  reference pvVar4;
  pointer pBVar5;
  size_t sVar6;
  Board *this_00;
  uint savedBoardSize;
  undefined1 local_48 [8];
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> values;
  IOBoard ioBoard;
  string *file_local;
  Controller *this_local;
  
  IOBoard::readBoardFromFile
            ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_48,
             (IOBoard *)
             &values.
              super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              .field_0x1f,file);
  bVar2 = std::operator==(local_48);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    pvVar3 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::operator->
                       ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                        local_48);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(pvVar3);
    vVar1 = *pvVar4;
    pBVar5 = std::unique_ptr<Board,_std::default_delete<Board>_>::operator->(&this->board);
    sVar6 = Board::getSizeInt(pBVar5);
    if ((uint)vVar1 == sVar6) {
      pvVar3 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::value
                         ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                          local_48);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(pvVar3);
      this_00 = (Board *)operator_new(0x38);
      pvVar3 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::value
                         ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                          local_48);
      pBVar5 = std::unique_ptr<Board,_std::default_delete<Board>_>::operator->(&this->board);
      size = Board::getSize(pBVar5);
      pBVar5 = std::unique_ptr<Board,_std::default_delete<Board>_>::operator->(&this->board);
      mode = Board::getMode(pBVar5);
      Board::Board(this_00,pvVar3,size,mode);
      std::unique_ptr<Board,_std::default_delete<Board>_>::reset(&this->board,this_00);
      this_local._7_1_ = true;
    }
    else {
      pvVar3 = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
               operator->((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                          local_48);
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(pvVar3);
      Message::putMessage(FILE_INFO_SIZE_IMPROPER,*pvVar4);
      this_local._7_1_ = false;
    }
  }
  std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~optional
            ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_48);
  return this_local._7_1_;
}

Assistant:

bool Controller::readBoardFromFile( const std::string& file )
{
    IOBoard ioBoard;
    auto values = ioBoard.readBoardFromFile( file );
    if ( values == std::nullopt )
    {
        return false;
    }

    uint savedBoardSize = values->back();
    if ( savedBoardSize != board->getSizeInt() ) {
        Message::putMessage( Result::FILE_INFO_SIZE_IMPROPER, values->back() );
        return false;
    }

    values.value().pop_back();
    board.reset( new Board( std::move( values.value() ), board->getSize(), board->getMode() ));
    return true;
}